

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::
CmpHelperNeIterator<int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b2,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> e2)

{
  bool bVar1;
  bool bVar2;
  AssertionResult *rhs;
  bool bVar3;
  Message ar;
  AssertionResult local_208;
  AssertionResult local_1e0;
  iuStreamMessage local_1b8;
  
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b8.m_stream);
  bVar3 = false;
  for (; this != (iuutil *)b1; this = this + 4) {
    if (e1 == b2._M_current) goto LAB_0016878e;
    iutest::internal::CmpHelperNE<int,int>
              (&local_1e0,(internal *)0x16f26a,"",(char *)this,e1,e2._M_current);
    iutest::AssertionResult::operator!(&local_208,&local_1e0);
    bVar1 = local_208.m_result;
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e0);
    bVar2 = true;
    if (bVar1 == true) {
      iutest::PrintToString<int>(&local_208.m_message,(int *)this);
      iutest::detail::iuStreamMessage::operator<<(&local_1b8,&local_208.m_message);
      std::__cxx11::string::~string((string *)&local_208);
      bVar2 = bVar3;
    }
    bVar3 = bVar2;
    e1 = e1 + 1;
  }
  if (e1 == b2._M_current && !bVar3) {
    local_208.m_message._M_dataplus._M_p = (pointer)&local_208.m_message.field_2;
    local_208.m_message._M_string_length = 0;
    local_208.m_message.field_2._M_local_buf[0] = '\0';
    local_208.m_result = false;
    rhs = iutest::AssertionResult::operator<<(&local_208,&local_1b8);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
LAB_0016878e:
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b8.m_stream);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = false;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::NeHelper<false>::Compare("", "", *b1, *b2))
        {
            ar << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2);
        }
        else
        {
            result = true;
        }
    }
    if( (b1 != e1) || (b2 != e2) )
    {
        result = true;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}